

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock.cc
# Opt level: O1

void fdb_add_inmem_stale_info
               (fdb_kvs_handle *handle,filemgr_header_revnum_t revnum,docio_object *doc,
               uint64_t doc_offset,bool system_doc_only)

{
  filemgr *pfVar1;
  avl_node *node;
  list_elem *e;
  list_elem *__dest;
  uint uVar2;
  stale_info_commit query;
  avl_node local_60;
  filemgr_header_revnum_t local_48;
  
  pfVar1 = handle->file;
  if (((pfVar1 == (filemgr *)0x0) || (pfVar1->config == (filemgr_config *)0x0)) ||
     (((pfVar1->config->block_reusing_threshold).super___atomic_base<unsigned_long>._M_i != 0 &&
      ((pfVar1->config->block_reusing_threshold).super___atomic_base<unsigned_long>._M_i != 100))))
  {
    local_48 = revnum;
    node = avl_search(&pfVar1->stale_info_tree,&local_60,_inmem_stale_cmp);
    if (node == (avl_node *)0x0) {
      node = (avl_node *)calloc(1,0x30);
      node[1].parent = (avl_node *)revnum;
      node[1].left = (avl_node *)0x0;
      node[1].right = (avl_node *)0x0;
      avl_insert(&pfVar1->stale_info_tree,node,_inmem_stale_cmp);
      (pfVar1->stale_info_tree_loaded)._M_base._M_i = true;
    }
    e = (list_elem *)calloc(1,0x30);
    if (system_doc_only) {
      e[1].prev = (list_elem *)0x0;
      uVar2 = 0;
    }
    else {
      uVar2 = (doc->length).bodylen;
      __dest = (list_elem *)calloc(1,(ulong)uVar2);
      e[1].prev = __dest;
      memcpy(__dest,doc->body,(ulong)uVar2);
    }
    *(uint *)&e[2].next = uVar2;
    *(uint *)((long)&e[2].next + 4) = uVar2;
    uVar2._0_2_ = (doc->length).keylen;
    uVar2._2_2_ = (doc->length).metalen;
    e[2].prev = (list_elem *)
                ((ulong)((uVar2 & 0xffff) + (uVar2 >> 0x10) + (doc->length).bodylen_ondisk) + 0x20);
    e[1].next = (list_elem *)doc_offset;
    list_push_back((list *)&node[1].left,e);
  }
  return;
}

Assistant:

static void fdb_add_inmem_stale_info(fdb_kvs_handle *handle,
                                     filemgr_header_revnum_t revnum,
                                     struct docio_object *doc,
                                     uint64_t doc_offset,
                                     bool system_doc_only)
{
    size_t buflen = 0;
    struct filemgr *file = handle->file;
    struct avl_node *a;
    struct stale_info_commit *item, query;
    struct stale_info_entry *entry;

    if (file && file->config) {
        if ( file->config->block_reusing_threshold == 0 ||
             file->config->block_reusing_threshold == 100 ) {
            // Block reuse is disabled,
            // we don't need to maintain stale info in-memory.
            return;
        }
    }

    // search using revnum first
    query.revnum = revnum;
    a = avl_search(&file->stale_info_tree, &query.avl, _inmem_stale_cmp);
    if (a) {
        // already exist
        item = _get_entry(a, struct stale_info_commit, avl);
    } else {
        // not exist .. create a new one and insert into tree
        item = (struct stale_info_commit *)calloc(1, sizeof(struct stale_info_commit));
        item->revnum = revnum;
        list_init(&item->doc_list);
        avl_insert(&file->stale_info_tree, &item->avl, _inmem_stale_cmp);
        file->stale_info_tree_loaded.store(true, std::memory_order_relaxed);
    }

    entry = (struct stale_info_entry *)calloc(1, sizeof(struct stale_info_entry));

    if (!system_doc_only) {
#ifdef _DOC_COMP
        if (compress_inmem_stale_info) {
            buflen = snappy_max_compressed_length(doc->length.bodylen);;
            entry->ctx = (void *)calloc(1, buflen);
            int ret = snappy_compress
                      ( (char*)doc->body, doc->length.bodylen,
                        (char*)entry->ctx, &buflen );
            if (ret != 0) {
                fdb_log(NULL, FDB_LOG_ERROR, FDB_RESULT_COMPRESSION_FAIL,
                        "(fdb_add_inmem_stale_info) "
                        "Compression error from a database file '%s'"
                        ": return value %d, header revnum %" _F64 ", "
                        "doc offset %" _F64 "\n",
                        file->filename, ret, revnum, doc_offset);
                if (!a) {
                    // 'item' is allocated in this function call.
                    avl_remove(&file->stale_info_tree, &item->avl);
                    free(item);
                }
                free(entry);
                return;
            }
        } else {
            buflen = doc->length.bodylen;
            entry->ctx = (void *)calloc(1, buflen);
            memcpy(entry->ctx, doc->body, doc->length.bodylen);
        }
#else
        buflen = doc->length.bodylen;
        entry->ctx = (void *)calloc(1, buflen);
        memcpy(entry->ctx, doc->body, doc->length.bodylen);
#endif

        entry->ctxlen = doc->length.bodylen;

    } else {
        // when 'system_doc_only' flag is set, just set to NULL.
        // we need the doc's length and offset info only.
        entry->ctx = NULL;
        entry->ctxlen = 0;
    }

    entry->comp_ctxlen = buflen;
    entry->doclen = _fdb_get_docsize(doc->length);
    entry->offset = doc_offset;
    list_push_back(&item->doc_list, &entry->le);
}